

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  uint uVar1;
  BPMNode **ppBVar2;
  BPMNode **ppBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  BPMNode *pBVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  if (lists->numfree <= lists->nextfree) {
    uVar6 = (ulong)lists->memsize;
    if (uVar6 != 0) {
      uVar9 = uVar6 + 0xf & 0xfffffffffffffff0;
      auVar10 = vpbroadcastq_avx512f();
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar13 = vpbroadcastq_avx512f(ZEXT816(0x18));
      auVar14 = vpbroadcastq_avx512f(ZEXT816(0x10));
      do {
        uVar4 = vpcmpuq_avx512f(auVar11,auVar10,2);
        uVar5 = vpcmpuq_avx512f(auVar12,auVar10,2);
        auVar15 = vpmullq_avx512dq(auVar11,auVar13);
        auVar16 = vpmullq_avx512dq(auVar12,auVar13);
        vpscatterqd_avx512f(ZEXT832(lists->memory) + ZEXT832(0x10) + auVar16._0_32_,uVar5,
                            SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        vpscatterqd_avx512f(ZEXT832(lists->memory) + ZEXT832(0x10) + auVar15._0_32_,uVar4,
                            SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar12 = vpaddq_avx512f(auVar12,auVar14);
        auVar11 = vpaddq_avx512f(auVar11,auVar14);
        uVar9 = uVar9 - 0x10;
      } while (uVar9 != 0);
    }
    uVar1 = lists->listsize;
    if ((ulong)uVar1 != 0) {
      ppBVar2 = lists->chains0;
      ppBVar3 = lists->chains1;
      uVar9 = 0;
      do {
        for (pBVar7 = ppBVar2[uVar9]; pBVar7 != (BPMNode *)0x0; pBVar7 = pBVar7->tail) {
          pBVar7->in_use = 1;
        }
        for (pBVar7 = ppBVar3[uVar9]; pBVar7 != (BPMNode *)0x0; pBVar7 = pBVar7->tail) {
          pBVar7->in_use = 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
    }
    lists->numfree = 0;
    if (uVar6 != 0) {
      lVar8 = 0;
      do {
        if (*(int *)((long)&lists->memory->in_use + lVar8) == 0) {
          uVar1 = lists->numfree;
          lists->numfree = uVar1 + 1;
          lists->freelist[uVar1] = (BPMNode *)((long)&lists->memory->weight + lVar8);
        }
        lVar8 = lVar8 + 0x18;
      } while (uVar6 * 0x18 != lVar8);
    }
    lists->nextfree = 0;
  }
  uVar1 = lists->nextfree;
  lists->nextfree = uVar1 + 1;
  pBVar7 = lists->freelist[uVar1];
  pBVar7->weight = weight;
  pBVar7->index = index;
  pBVar7->tail = tail;
  return pBVar7;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
  unsigned i;
  BPMNode* result;

  /*memory full, so garbage collect*/
  if(lists->nextfree >= lists->numfree)
  {
    /*mark only those that are in use*/
    for(i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
    for(i = 0; i != lists->listsize; ++i)
    {
      BPMNode* node;
      for(node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
      for(node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
    }
    /*collect those that are free*/
    lists->numfree = 0;
    for(i = 0; i != lists->memsize; ++i)
    {
      if(!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
    }
    lists->nextfree = 0;
  }

  result = lists->freelist[lists->nextfree++];
  result->weight = weight;
  result->index = index;
  result->tail = tail;
  return result;
}